

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

void __thiscall BuildLog::~BuildLog(BuildLog *this)

{
  BuildLog *this_local;
  
  Close(this);
  std::__cxx11::string::~string((string *)&this->log_file_path_);
  std::
  unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
  ::~unordered_map(&this->entries_);
  return;
}

Assistant:

BuildLog::~BuildLog() {
  Close();
}